

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher_dirk.c
# Opt level: O1

ARKodeButcherTable ARKodeButcherTable_LoadDIRK(ARKODE_DIRKTableID imethod)

{
  double *pdVar1;
  sunrealtype *psVar2;
  double dVar3;
  sunrealtype **ppsVar4;
  sunrealtype *psVar5;
  ARKodeButcherTable pAVar6;
  sunrealtype sVar7;
  sunrealtype *psVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  
  switch(imethod) {
  case ARKODE_MIN_DIRK_NUM:
    pAVar6 = ARKodeButcherTable_Alloc(2,1);
    pAVar6->q = 2;
    pAVar6->p = 1;
    ppsVar4 = pAVar6->A;
    **ppsVar4 = 1.0;
    psVar5 = ppsVar4[1];
    *psVar5 = -1.0;
    psVar5[1] = 1.0;
    psVar5 = pAVar6->b;
    *psVar5 = 0.5;
    psVar5[1] = 0.5;
    *pAVar6->d = 1.0;
    psVar5 = pAVar6->c;
    *psVar5 = 1.0;
    psVar5[1] = 0.0;
    break;
  case ARKODE_BILLINGTON_3_3_2:
    pAVar6 = ARKodeButcherTable_Alloc(3,1);
    pAVar6->q = 2;
    pAVar6->p = 3;
    ppsVar4 = pAVar6->A;
    **ppsVar4 = 0.2928932188134525;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.7989898732233307;
    psVar5[1] = 0.2928932188134525;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.7407892288408794;
    psVar5[1] = 0.25921077115912056;
    psVar5[2] = 0.2928932188134525;
    psVar5 = pAVar6->d;
    *psVar5 = 0.6916651159922363;
    psVar5[1] = 0.5035970298833986;
    psVar5[2] = -0.19526214587563498;
    psVar5 = pAVar6->b;
    *psVar5 = 0.7407892288408794;
    psVar5[1] = 0.25921077115912056;
    psVar5 = pAVar6->c;
    *psVar5 = 0.2928932188134525;
    psVar5[1] = 1.0918830920367832;
    psVar5[2] = 1.2928932188134525;
    break;
  case ARKODE_TRBDF2_3_3_2:
    pAVar6 = ARKodeButcherTable_Alloc(3,1);
    pAVar6->q = 2;
    pAVar6->p = 3;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.2928932188134524;
    psVar5[1] = 0.2928932188134524;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.3535533905932738;
    psVar5[1] = 0.3535533905932738;
    sVar7 = 0.2928932188134524;
    psVar5[2] = 0.2928932188134524;
    psVar5 = pAVar6->d;
    *psVar5 = 0.21548220313557542;
    psVar5[1] = 0.6868867239266071;
    psVar5[2] = 0.09763107293781748;
    psVar5 = pAVar6->b;
    *psVar5 = 0.3535533905932738;
    psVar5[1] = 0.3535533905932738;
    goto LAB_0012bc88;
  case ARKODE_KVAERNO_4_2_3:
    pAVar6 = ARKodeButcherTable_Alloc(4,1);
    pAVar6->q = 3;
    pAVar6->p = 2;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.435866521508459;
    psVar5[1] = 0.435866521508459;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.49056338842178054;
    psVar5[1] = 0.07357009006976042;
    psVar5[2] = 0.435866521508459;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.30880996997674653;
    psVar5[1] = 1.4905633884217806;
    psVar5[2] = -1.2352398799069861;
    psVar5[3] = 0.435866521508459;
    psVar5 = pAVar6->b;
    *psVar5 = 0.30880996997674653;
    psVar5[1] = 1.4905633884217806;
    psVar5[2] = -1.2352398799069861;
    psVar5[3] = 0.435866521508459;
    psVar5 = pAVar6->d;
    *psVar5 = 0.49056338842178054;
    psVar5[1] = 0.07357009006976042;
    psVar5[2] = 0.435866521508459;
    psVar5 = pAVar6->c;
    uVar13 = 0;
    uVar14 = 0x3ff00000;
    goto LAB_0012abfb;
  case ARKODE_ARK324L2SA_DIRK_4_2_3:
    pAVar6 = ARKodeButcherTable_Alloc(4,1);
    pAVar6->q = 3;
    pAVar6->p = 2;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.435866521508459;
    psVar5[1] = 0.435866521508459;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.2576482460664272;
    psVar5[1] = -0.09351476757488625;
    psVar5[2] = 0.435866521508459;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.18764102434672383;
    psVar5[1] = -0.595297473576955;
    psVar5[2] = 0.9717899277217721;
    psVar5[3] = 0.435866521508459;
    psVar5 = pAVar6->b;
    *psVar5 = 0.18764102434672383;
    psVar5[1] = -0.595297473576955;
    psVar5[2] = 0.9717899277217721;
    psVar5[3] = 0.435866521508459;
    psVar5 = pAVar6->d;
    *psVar5 = 0.21474028622338914;
    psVar5[1] = -0.4851622638849391;
    uVar13 = 0x60615cd5;
    uVar14 = 0x3febcc98;
    uVar15 = 0x3ac889ea;
    uVar16 = 0x3fd9b567;
    goto LAB_0012a73a;
  case ARKODE_CASH_5_2_4:
    pAVar6 = ARKodeButcherTable_Alloc(5,1);
    pAVar6->q = 4;
    pAVar6->p = 2;
    ppsVar4 = pAVar6->A;
    **ppsVar4 = 0.435866521508459;
    psVar5 = ppsVar4[1];
    *psVar5 = -1.135866521508459;
    psVar5[1] = 0.435866521508459;
    psVar5 = ppsVar4[2];
    *psVar5 = 1.0854333065011879;
    psVar5[1] = -0.7212998280096468;
    psVar5[2] = 0.435866521508459;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.41634950157878;
    psVar5[1] = 0.19098400417955613;
    psVar5[2] = -0.11864326546011505;
    psVar5[3] = 0.435866521508459;
    psVar5 = ppsVar4[4];
    *psVar5 = 0.8968696529704295;
    psVar5[1] = 0.018272527273968903;
    psVar5[2] = -0.08459003110197204;
    psVar5[3] = -0.2664186706508854;
    psVar5[4] = 0.435866521508459;
    psVar5 = pAVar6->b;
    *psVar5 = 0.8968696529704295;
    psVar5[1] = 0.018272527273968903;
    psVar5[2] = -0.08459003110197204;
    psVar5[3] = -0.2664186706508854;
    psVar5[4] = 0.435866521508459;
    psVar5 = pAVar6->d;
    *psVar5 = 1.0564621610700966;
    psVar5[1] = -0.05646216107009664;
    goto LAB_0012b459;
  case ARKODE_CASH_5_3_4:
    pAVar6 = ARKodeButcherTable_Alloc(5,1);
    pAVar6->q = 4;
    pAVar6->p = 3;
    ppsVar4 = pAVar6->A;
    **ppsVar4 = 0.435866521508459;
    psVar5 = ppsVar4[1];
    *psVar5 = -1.135866521508459;
    psVar5[1] = 0.435866521508459;
    psVar5 = ppsVar4[2];
    *psVar5 = 1.0854333065011879;
    psVar5[1] = -0.7212998280096468;
    psVar5[2] = 0.435866521508459;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.41634950157878;
    psVar5[1] = 0.19098400417955613;
    psVar5[2] = -0.11864326546011505;
    psVar5[3] = 0.435866521508459;
    psVar5 = ppsVar4[4];
    *psVar5 = 0.8968696529704295;
    psVar5[1] = 0.018272527273968903;
    psVar5[2] = -0.08459003110197204;
    psVar5[3] = -0.2664186706508854;
    psVar5[4] = 0.435866521508459;
    psVar5 = pAVar6->b;
    *psVar5 = 0.8968696529704295;
    psVar5[1] = 0.018272527273968903;
    psVar5[2] = -0.08459003110197204;
    psVar5[3] = -0.2664186706508854;
    psVar5[4] = 0.435866521508459;
    psVar5 = pAVar6->d;
    *psVar5 = 0.7766919329157524;
    psVar5[1] = 0.02974727915032039;
    psVar5[2] = -0.026744023915640965;
    psVar5[3] = 0.22030481184956816;
LAB_0012b459:
    psVar5 = pAVar6->c;
    *psVar5 = 0.435866521508459;
    psVar5[1] = -0.7;
    uVar13 = 0x3fe99999;
    uVar14 = 0xfe82bd9;
    uVar15 = 0x3fed95f8;
LAB_0012b46f:
    *(undefined4 *)(psVar5 + 2) = 0x9999999a;
    *(undefined4 *)((long)psVar5 + 0x14) = uVar13;
    *(undefined4 *)(psVar5 + 3) = uVar14;
    *(undefined4 *)((long)psVar5 + 0x1c) = uVar15;
    psVar5[4] = 1.0;
    break;
  case ARKODE_SDIRK_5_3_4:
    pAVar6 = ARKodeButcherTable_Alloc(5,1);
    pAVar6->q = 4;
    pAVar6->p = 3;
    ppsVar4 = pAVar6->A;
    **ppsVar4 = 0.25;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.5;
    psVar5[1] = 0.25;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.34;
    psVar5[1] = -0.04;
    psVar5[2] = 0.25;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.2727941176470588;
    psVar5[1] = -0.05036764705882353;
    psVar5[2] = 0.027573529411764705;
    psVar5[3] = 0.25;
    psVar5 = ppsVar4[4];
    *psVar5 = 1.0416666666666667;
    psVar5[1] = -1.0208333333333333;
    psVar5[2] = 7.8125;
    psVar5[3] = -7.083333333333333;
    psVar5[4] = 0.25;
    psVar5 = pAVar6->b;
    *psVar5 = 1.0416666666666667;
    psVar5[1] = -1.0208333333333333;
    psVar5[2] = 7.8125;
    psVar5[3] = -7.083333333333333;
    psVar5[4] = 0.25;
    psVar5 = pAVar6->d;
    *psVar5 = 1.2291666666666667;
    psVar5[1] = -0.17708333333333334;
    psVar5[2] = 7.03125;
    psVar5[3] = -7.083333333333333;
    psVar5 = pAVar6->c;
    *psVar5 = 0.25;
    psVar5[1] = 0.75;
    uVar13 = 0x3fe19999;
    uVar14 = 0;
    uVar15 = 0x3fe00000;
    goto LAB_0012b46f;
  case ARKODE_KVAERNO_5_3_4:
    pAVar6 = ARKodeButcherTable_Alloc(5,1);
    pAVar6->q = 4;
    pAVar6->p = 3;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.435866521508459;
    psVar5[1] = 0.435866521508459;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.1407377747247062;
    psVar5[1] = -0.1083655513813208;
    psVar5[2] = 0.435866521508459;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.102399400619911;
    psVar5[1] = -0.3768784522555561;
    psVar5[2] = 0.8386125301271861;
    psVar5[3] = 0.435866521508459;
    psVar5 = ppsVar4[4];
    *psVar5 = 0.15702489786032495;
    psVar5[1] = 0.11733044137043885;
    psVar5[2] = 0.6166780303921214;
    psVar5[3] = -0.32689989113134427;
    psVar5[4] = 0.435866521508459;
    psVar5 = pAVar6->b;
    *psVar5 = 0.15702489786032495;
    psVar5[1] = 0.11733044137043885;
    psVar5[2] = 0.6166780303921214;
    psVar5[3] = -0.32689989113134427;
    psVar5[4] = 0.435866521508459;
    psVar5 = pAVar6->d;
    *psVar5 = 0.102399400619911;
    psVar5[1] = -0.3768784522555561;
    psVar5[2] = 0.8386125301271861;
    psVar5[3] = 0.435866521508459;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.871733043016918;
    psVar5[2] = 0.4682387448518444;
    psVar5[3] = 1.0;
    psVar5[4] = 1.0;
    break;
  case ARKODE_ARK436L2SA_DIRK_6_3_4:
    pAVar6 = ARKodeButcherTable_Alloc(6,1);
    pAVar6->q = 4;
    pAVar6->p = 3;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.25;
    psVar5[1] = 0.25;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.137776;
    psVar5[1] = -0.055776;
    psVar5[2] = 0.25;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.14463686602698217;
    psVar5[1] = -0.22393190761334475;
    psVar5[2] = 0.4492950415863626;
    psVar5[3] = 0.25;
    psVar5 = ppsVar4[4];
    *psVar5 = 0.09825878328356477;
    psVar5[1] = -0.5915442428196704;
    psVar5[2] = 0.8101210538282996;
    psVar5[3] = 0.283164405707806;
    psVar5[4] = 0.25;
    psVar5 = ppsVar4[5];
    *psVar5 = 0.15791629516167136;
    psVar5[2] = 0.18675894052400077;
    psVar5[3] = 0.6805652953093346;
    psVar5[4] = -0.27524053099500667;
    psVar5[5] = 0.25;
    psVar5 = pAVar6->b;
    *psVar5 = 0.15791629516167136;
    psVar5[2] = 0.18675894052400077;
    psVar5[3] = 0.6805652953093346;
    psVar5[4] = -0.27524053099500667;
    psVar5[5] = 0.25;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.5;
    psVar5[2] = 0.332;
    psVar5[3] = 0.62;
    psVar5[4] = 0.85;
    psVar5[5] = 1.0;
    psVar5 = pAVar6->d;
    *psVar5 = 0.15471180076321217;
    psVar5[2] = 0.18920519166068023;
    psVar5[3] = 0.7020453712289219;
    psVar5[4] = -0.3191873990635791;
    psVar5[5] = 0.27322503541076487;
    break;
  case ARKODE_KVAERNO_7_4_5:
    pAVar6 = ARKodeButcherTable_Alloc(7,1);
    pAVar6->q = 5;
    pAVar6->p = 4;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.26;
    psVar5[1] = 0.26;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.13;
    psVar5[1] = 0.8403332099679081;
    psVar5[2] = 0.26;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.22371961478320507;
    psVar5[1] = 0.476755323197997;
    psVar5[2] = -0.06470895363112615;
    psVar5[3] = 0.26;
    psVar5 = ppsVar4[4];
    *psVar5 = 0.16648564323248322;
    psVar5[1] = 0.1045001884159172;
    psVar5[2] = 0.03631482272098715;
    psVar5[3] = -0.13090704451073998;
    psVar5[4] = 0.26;
    psVar5 = ppsVar4[5];
    *psVar5 = 0.13855640231268224;
    psVar5[2] = -0.04245337201752043;
    psVar5[3] = 0.02446657898003142;
    psVar5[4] = 0.6194303907248068;
    psVar5[5] = 0.26;
    psVar5 = ppsVar4[6];
    *psVar5 = 0.13659751177640292;
    psVar5[2] = -0.054969087965383766;
    psVar5[3] = -0.04118626728321047;
    psVar5[4] = 0.629933048990164;
    psVar5[5] = 0.06962479448202728;
    psVar5[6] = 0.26;
    psVar5 = pAVar6->b;
    *psVar5 = 0.13659751177640292;
    psVar5[2] = -0.054969087965383766;
    psVar5[3] = -0.04118626728321047;
    psVar5[4] = 0.629933048990164;
    psVar5[5] = 0.06962479448202728;
    psVar5[6] = 0.26;
    psVar5 = pAVar6->d;
    *psVar5 = 0.13855640231268224;
    psVar5[2] = -0.04245337201752043;
    psVar5[3] = 0.02446657898003142;
    psVar5[4] = 0.6194303907248068;
    psVar5[5] = 0.26;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.52;
    psVar5[2] = 1.230333209967908;
    psVar5[3] = 0.8957659843500759;
    psVar5[4] = 0.43639360985864756;
    psVar5[5] = 1.0;
    psVar5[6] = 1.0;
    break;
  case ARKODE_ARK548L2SA_DIRK_8_4_5:
    pAVar6 = ARKodeButcherTable_Alloc(8,1);
    pAVar6->q = 5;
    pAVar6->p = 4;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.205;
    psVar5[1] = 0.205;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.1025;
    psVar5[1] = -0.047570415551619845;
    psVar5[2] = 0.205;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.07389944079200692;
    psVar5[2] = -0.08074895409950329;
    psVar5[3] = 0.205;
    psVar5 = ppsVar4[4];
    *psVar5 = 0.299218118308015;
    psVar5[2] = 2.4638206661140414;
    psVar5[3] = -2.0480387844220567;
    psVar5[4] = 0.205;
    psVar5 = ppsVar4[5];
    *psVar5 = 0.14689238442881303;
    psVar5[2] = 0.11740332879881549;
    psVar5[3] = -0.221701968002454;
    psVar5[4] = -0.007593745225174481;
    psVar5[5] = 0.205;
    psVar5 = ppsVar4[6];
    *psVar5 = 0.17845729560319554;
    psVar5[2] = 1.0197467452199207;
    psVar5[3] = -0.22154535039396367;
    psVar5[4] = -0.03612491620526532;
    psVar5[5] = -0.5455337742238872;
    psVar5[6] = 0.205;
    psVar5 = ppsVar4[7];
    *psVar5 = -0.09554858675139874;
    psVar5[3] = 2.3386928037652464;
    psVar5[4] = -0.14043175608247527;
    psVar5[5] = -2.070587707956559;
    psVar5[6] = 0.7628752470251866;
    psVar5[7] = 0.205;
    psVar5 = pAVar6->b;
    *psVar5 = -0.09554858675139874;
    psVar5[3] = 2.3386928037652464;
    psVar5[4] = -0.14043175608247527;
    psVar5[5] = -2.070587707956559;
    psVar5[6] = 0.7628752470251866;
    psVar5[7] = 0.205;
    psVar5 = pAVar6->d;
    *psVar5 = -0.09957696480500873;
    psVar5[3] = 2.407162879999775;
    psVar5[4] = -0.1601481830855136;
    psVar5[5] = -2.1442365964445265;
    psVar5[6] = 0.7795656224249983;
    psVar5[7] = 0.21723324191027585;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.41;
    psVar5[2] = 0.25992958444838016;
    psVar5[3] = 0.19815048669250362;
    psVar5[4] = 0.92;
    uVar13 = 0xeb851eb8;
    uVar14 = 0x3fceb851;
    uVar15 = 0x33333333;
    uVar16 = 0x3fe33333;
    goto LAB_0012b390;
  case ARKODE_ARK437L2SA_DIRK_7_3_4:
    pAVar6 = ARKodeButcherTable_Alloc(7,1);
    pAVar6->q = 4;
    pAVar6->p = 3;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.1235;
    psVar5[1] = 0.1235;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.14907768747653863;
    psVar5[1] = 0.14907768747653863;
    psVar5[2] = 0.1235;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.12483442871739439;
    psVar5[1] = 0.12483442871739439;
    psVar5[2] = -0.03816885743478878;
    psVar5[3] = 0.1235;
    psVar5 = ppsVar4[4];
    *psVar5 = -0.07303194030218091;
    psVar5[1] = -0.07303194030218091;
    psVar5[2] = -0.2434356871601467;
    psVar5[3] = 0.3409995677645085;
    psVar5[4] = 0.1235;
    psVar5 = ppsVar4[5];
    *psVar5 = -0.15296500088128806;
    psVar5[1] = -0.15296500088128806;
    psVar5[2] = 0.07220562047433587;
    psVar5[3] = 0.40430630248551713;
    psVar5[4] = 0.4059180788027232;
    psVar5[5] = 0.1235;
    psVar5 = ppsVar4[6];
    psVar5[2] = 0.5161107283174237;
    psVar5[3] = -0.1460635639385708;
    psVar5[4] = 0.23473048589019332;
    psVar5[5] = 0.27172234973095377;
    psVar5[6] = 0.1235;
    psVar5 = pAVar6->b;
    psVar5[2] = 0.5161107283174237;
    psVar5[3] = -0.1460635639385708;
    psVar5[4] = 0.23473048589019332;
    psVar5[5] = 0.27172234973095377;
    psVar5[6] = 0.1235;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.247;
    psVar5[2] = 0.42165537495307726;
    psVar5[3] = 0.335;
    psVar5[4] = 0.075;
    psVar5[5] = 0.7;
    psVar5[6] = 1.0;
    psVar5 = pAVar6->d;
    psVar5[2] = 0.5175217461593482;
    psVar5[3] = -0.15173820706113939;
    psVar5[4] = 0.23672007870234135;
    psVar5[5] = 0.2754463821994498;
    psVar5[6] = 0.12205;
    break;
  case ARKODE_ARK548L2SAb_DIRK_8_4_5:
    pAVar6 = ARKodeButcherTable_Alloc(8,1);
    pAVar6->q = 5;
    pAVar6->p = 4;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.2222222222222222;
    psVar5[1] = 0.2222222222222222;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.26824595137478835;
    psVar5[1] = 0.26824595137478835;
    psVar5[2] = 0.2222222222222222;
    psVar5 = ppsVar4[3];
    *psVar5 = -0.057945592237231995;
    psVar5[1] = -0.057945592237231995;
    psVar5[2] = 0.008938396816283733;
    psVar5[3] = 0.2222222222222222;
    psVar5 = ppsVar4[4];
    *psVar5 = -0.043305287723547685;
    psVar5[1] = -0.043305287723547685;
    psVar5[2] = -0.034013891077568637;
    psVar5[3] = 0.25515937270676026;
    psVar5[4] = 0.2222222222222222;
    psVar5 = ppsVar4[5];
    *psVar5 = 0.13179599023759678;
    psVar5[1] = 0.13179599023759678;
    psVar5[2] = -0.03237672627786233;
    psVar5[3] = 0.12385474427672251;
    psVar5[4] = 0.14270777930372408;
    psVar5[5] = 0.2222222222222222;
    psVar5 = ppsVar4[6];
    *psVar5 = 0.3093228210043426;
    psVar5[1] = 0.3093228210043426;
    psVar5[2] = -0.6829199272336792;
    psVar5[3] = -0.05882275614969546;
    psVar5[4] = -0.04130861383349944;
    psVar5[5] = 0.8971834329859666;
    psVar5[6] = 0.2222222222222222;
    psVar5 = ppsVar4[7];
    psVar5[2] = 0.1736625357358126;
    psVar5[3] = 0.2547916626081235;
    psVar5[4] = 0.2419017684509479;
    psVar5[5] = 0.30740485830222825;
    psVar5[6] = -0.19998304731933453;
    psVar5[7] = 0.2222222222222222;
    psVar5 = pAVar6->b;
    psVar5[2] = 0.1736625357358126;
    psVar5[3] = 0.2547916626081235;
    psVar5[4] = 0.2419017684509479;
    psVar5[5] = 0.30740485830222825;
    psVar5[6] = -0.19998304731933453;
    psVar5[7] = 0.2222222222222222;
    psVar5 = pAVar6->d;
    psVar5[2] = 0.06272421695270713;
    psVar5[3] = 0.25523315714677963;
    psVar5[4] = 0.23902754916001318;
    psVar5[5] = 0.399079522075358;
    psVar5[6] = -0.14315725125850667;
    psVar5[7] = 0.18709280592364871;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.4444444444444444;
    psVar5[2] = 0.7587141249717989;
    psVar5[3] = 0.11526943456404197;
    psVar5[4] = 0.3567571284043185;
    uVar13 = 0x70a3d70a;
    uVar14 = 0x3fe70a3d;
    uVar15 = 0x28f5c28f;
    uVar16 = 0x3fee8f5c;
LAB_0012b390:
    *(undefined4 *)(psVar5 + 5) = uVar13;
    *(undefined4 *)((long)psVar5 + 0x2c) = uVar14;
    *(undefined4 *)(psVar5 + 6) = uVar15;
    *(undefined4 *)((long)psVar5 + 0x34) = uVar16;
    psVar5[7] = 1.0;
    break;
  case ARKODE_ESDIRK324L2SA_4_2_3:
    pAVar6 = ARKodeButcherTable_Alloc(4,1);
    pAVar6->q = 3;
    pAVar6->p = 2;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.435866521508459;
    psVar5[1] = 0.435866521508459;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.2576482460664272;
    psVar5[1] = -0.09351476757488625;
    psVar5[2] = 0.435866521508459;
    psVar5 = ppsVar4[3];
    *psVar5 = 0.18764102434672383;
    psVar5[1] = -0.595297473576955;
    psVar5[2] = 0.9717899277217721;
    psVar5[3] = 0.435866521508459;
    psVar5 = pAVar6->b;
    *psVar5 = 0.18764102434672383;
    psVar5[1] = -0.595297473576955;
    psVar5[2] = 0.9717899277217721;
    psVar5[3] = 0.435866521508459;
    psVar5 = pAVar6->d;
    *psVar5 = 0.10889661761586446;
    psVar5[1] = -0.9153258118707127;
    uVar13 = 0xfbcae572;
    uVar14 = 0x3ff45722;
    uVar15 = 0xa165dcab;
    uVar16 = 0x3fe11ffe;
LAB_0012a73a:
    *(undefined4 *)(psVar5 + 2) = uVar13;
    *(undefined4 *)((long)psVar5 + 0x14) = uVar14;
    *(undefined4 *)(psVar5 + 3) = uVar15;
    *(undefined4 *)((long)psVar5 + 0x1c) = uVar16;
    psVar5 = pAVar6->c;
    uVar13 = 0x33333333;
    uVar14 = 0x3fe33333;
LAB_0012abfb:
    *(undefined4 *)(psVar5 + 1) = 0xb1d33509;
    *(undefined4 *)((long)psVar5 + 0xc) = 0x3febe53c;
    *(undefined4 *)(psVar5 + 2) = uVar13;
    *(undefined4 *)((long)psVar5 + 0x14) = uVar14;
    psVar5[3] = 1.0;
    break;
  case ARKODE_ESDIRK325L2SA_5_2_3:
    pAVar6 = ARKodeButcherTable_Alloc(5,1);
    pAVar6->q = 3;
    pAVar6->p = 2;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.45;
    psVar5[2] = 0.7681980515339464;
    psVar5[3] = 0.6;
    psVar5[4] = 1.0;
    psVar5 = pAVar6->b;
    *psVar5 = 0.17554550212940523;
    psVar5[1] = 0.17554550212940523;
    psVar5[2] = -0.34685820002600626;
    psVar5[3] = 0.7707671957671958;
    psVar5[4] = 0.225;
    psVar8 = pAVar6->d;
    *psVar8 = 0.18435122201605925;
    psVar8[1] = 0.18435122201605925;
    psVar8[2] = -0.278208184050987;
    psVar8[3] = 0.6968620125433237;
    psVar8[4] = 0.21264372747554489;
    ppsVar4 = pAVar6->A;
    psVar8 = ppsVar4[1];
    *psVar8 = 0.225;
    psVar8[1] = 0.225;
    psVar8 = ppsVar4[2];
    *psVar8 = 0.2715990257669732;
    psVar8[1] = 0.2715990257669732;
    psVar8[2] = 0.225;
    psVar8 = ppsVar4[3];
    *psVar8 = 0.22374368670764586;
    psVar8[1] = 0.22374368670764586;
    uVar13 = 0x52310dd6;
    uVar14 = 0xbfb28e88;
    goto LAB_0012ab36;
  case ARKODE_ESDIRK32I5L2SA_5_2_3:
    pAVar6 = ARKodeButcherTable_Alloc(5,1);
    pAVar6->q = 3;
    pAVar6->p = 2;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.45;
    psVar5[2] = 0.8;
    psVar5[3] = 1.0;
    psVar5[4] = 1.0;
    psVar5 = pAVar6->b;
    *psVar5 = 0.21322176213480562;
    psVar5[1] = 0.3260047980544875;
    psVar5[2] = 0.5373779946761313;
    psVar5[3] = -0.3016045548654244;
    psVar5[4] = 0.225;
    psVar8 = pAVar6->d;
    *psVar8 = 0.2272160877233341;
    psVar8[1] = 0.3255666195624788;
    psVar8[2] = 0.46861135758651284;
    psVar8[3] = -0.20520648979080866;
    psVar8[4] = 0.18381242491848293;
    ppsVar4 = pAVar6->A;
    psVar8 = ppsVar4[1];
    *psVar8 = 0.225;
    psVar8[1] = 0.225;
    psVar8 = ppsVar4[2];
    *psVar8 = 0.2638888888888889;
    psVar8[1] = 0.3111111111111111;
    psVar8[2] = 0.225;
    psVar8 = ppsVar4[3];
    *psVar8 = 0.2896701388888889;
    psVar8[1] = 0.3236111111111111;
    uVar13 = 0x33333333;
    uVar14 = 0x3fc4b333;
LAB_0012ab36:
    *(undefined4 *)(psVar8 + 2) = uVar13;
    *(undefined4 *)((long)psVar8 + 0x14) = uVar14;
    *(undefined4 *)(psVar8 + 3) = 0xcccccccd;
    *(undefined4 *)((long)psVar8 + 0x1c) = 0x3fcccccc;
    psVar8 = ppsVar4[4];
    *psVar8 = *psVar5;
    psVar8[1] = psVar5[1];
    psVar8[2] = psVar5[2];
    psVar8[3] = psVar5[3];
    psVar8[4] = psVar5[4];
    break;
  case ARKODE_ESDIRK436L2SA_6_3_4:
    pAVar6 = ARKodeButcherTable_Alloc(6,1);
    pAVar6->q = 4;
    pAVar6->p = 3;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.5;
    psVar5[2] = 0.1464466094067262;
    psVar5[3] = 0.625;
    psVar5[4] = 1.04;
    psVar5[5] = 1.0;
    psVar8 = pAVar6->b;
    *psVar8 = -0.015587635035716509;
    psVar8[1] = -0.015587635035716509;
    psVar8[2] = 0.3876576709132033;
    psVar8[3] = 0.5017726195721631;
    psVar8[4] = -0.10825502041393352;
    psVar8[5] = 0.25;
    psVar2 = pAVar6->d;
    *psVar2 = -0.09651334216818033;
    psVar2[1] = -0.09651334216818033;
    psVar2[2] = 0.5228199509962342;
    psVar2[3] = 0.5205678646221885;
    psVar2[4] = -0.08255805440762122;
    psVar2[5] = 0.23219692312555915;
    ppsVar4 = pAVar6->A;
    pdVar12 = ppsVar4[1];
    pdVar12[1] = 0.25;
    pdVar11 = ppsVar4[2];
    pdVar11[1] = -0.05177669529663689;
    pdVar11[2] = 0.25;
    pdVar10 = ppsVar4[3];
    pdVar10[1] = -0.07655460838455729;
    pdVar10[2] = 0.5281092167691145;
    pdVar10[3] = 0.25;
    pdVar9 = ppsVar4[4];
    pdVar9[1] = -0.7274063478261299;
    pdVar9[2] = 1.5849950617406794;
    uVar13 = 0xdedf2dc7;
    uVar14 = 0x3fe51d39;
    goto LAB_0012b564;
  case ARKODE_ESDIRK43I6L2SA_6_3_4:
    pAVar6 = ARKodeButcherTable_Alloc(6,1);
    pAVar6->q = 4;
    pAVar6->p = 3;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.5;
    psVar5[2] = 0.1464466094067262;
    psVar5[3] = 0.5803591573139935;
    psVar5[4] = 1.0;
    psVar5[5] = 1.0;
    psVar8 = pAVar6->b;
    *psVar8 = 0.06632461208191097;
    psVar8[1] = 0.06632461208191097;
    psVar8[2] = 0.22236269423069369;
    psVar8[3] = 0.5021309387483415;
    psVar8[4] = -0.10714285714285714;
    psVar8[5] = 0.25;
    psVar2 = pAVar6->d;
    *psVar2 = -0.018437906120613;
    psVar2[1] = -0.018437906120613;
    psVar2[2] = 0.3643795346432077;
    psVar2[3] = 0.5162497304522604;
    psVar2[4] = -0.06251150951414057;
    psVar2[5] = 0.2187580566598984;
    ppsVar4 = pAVar6->A;
    pdVar12 = ppsVar4[1];
    pdVar12[1] = 0.25;
    pdVar11 = ppsVar4[2];
    pdVar11[1] = -0.05177669529663688;
    pdVar11[2] = 0.25;
    pdVar10 = ppsVar4[3];
    pdVar10[1] = -0.12100710522809056;
    pdVar10[2] = 0.5723733677701747;
    pdVar10[3] = 0.25;
    pdVar9 = ppsVar4[4];
    pdVar9[1] = -0.6119504017336055;
    pdVar9[2] = 1.3587904035004925;
    uVar13 = 0x1692b4b;
    uVar14 = 0x3fe3aefc;
LAB_0012b564:
    *(undefined4 *)(pdVar9 + 3) = uVar13;
    *(undefined4 *)((long)pdVar9 + 0x1c) = uVar14;
    *(undefined4 *)(pdVar9 + 4) = 0;
    *(undefined4 *)((long)pdVar9 + 0x24) = 0x3fd00000;
    psVar2 = ppsVar4[5];
    *psVar2 = *psVar8;
    psVar2[1] = psVar8[1];
    psVar2[2] = psVar8[2];
    psVar2[3] = psVar8[3];
    psVar2[4] = psVar8[4];
    psVar2[5] = psVar8[5];
    *pdVar12 = psVar5[1] - pdVar12[1];
    *pdVar11 = (psVar5[2] - pdVar11[1]) - pdVar11[2];
    *pdVar10 = ((psVar5[3] - pdVar10[1]) - pdVar10[2]) - pdVar10[3];
    dVar3 = (((psVar5[4] - pdVar9[1]) - pdVar9[2]) - pdVar9[3]) - pdVar9[4];
LAB_0012b600:
    *pdVar9 = dVar3;
    break;
  case ARKODE_QESDIRK436L2SA_6_3_4:
    pAVar6 = ARKodeButcherTable_Alloc(6,1);
    pAVar6->q = 4;
    pAVar6->p = 3;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.21333333333333335;
    psVar5[2] = 0.18745166004060956;
    psVar5[3] = 0.5237349638615413;
    psVar5[4] = 1.0437682988410166;
    psVar5[5] = 1.0;
    psVar5 = pAVar6->b;
    *psVar5 = 0.11507824627133408;
    psVar5[2] = 0.13891173144118288;
    psVar5[3] = 0.5589929940192544;
    psVar5[4] = -0.1329829717317714;
    psVar5[5] = 0.32;
    psVar8 = pAVar6->d;
    *psVar8 = -0.04435710074704296;
    psVar8[1] = -1.5839347397183428;
    psVar8[2] = 1.8584346081654304;
    psVar8[3] = 0.5780406793432736;
    psVar8[4] = -0.11463186751229457;
    psVar8[5] = 0.3064484204689764;
    ppsVar4 = pAVar6->A;
    psVar8 = ppsVar4[1];
    *psVar8 = 0.10666666666666667;
    psVar8[1] = 0.10666666666666667;
    psVar8 = ppsVar4[2];
    *psVar8 = 0.06627416997969521;
    psVar8[1] = -0.19882250993908562;
    psVar8[2] = 0.32;
    psVar8 = ppsVar4[3];
    *psVar8 = -0.4886087369119395;
    psVar8[1] = -6.190751520067358;
    psVar8[2] = 6.883095220840839;
    psVar8[3] = 0.32;
    psVar8 = ppsVar4[4];
    *psVar8 = -3.1283269307169475;
    psVar8[1] = -32.206585572984054;
    psVar8[2] = 35.100563192176956;
    psVar8[3] = 0.9581176103650633;
    psVar8[4] = 0.32;
    psVar8 = ppsVar4[5];
    *psVar8 = *psVar5;
    psVar8[1] = psVar5[1];
    psVar8[2] = psVar5[2];
    psVar8[3] = psVar5[3];
    psVar8[4] = psVar5[4];
    psVar8[5] = psVar5[5];
    break;
  case ARKODE_ESDIRK437L2SA_7_3_4:
    pAVar6 = ARKodeButcherTable_Alloc(7,1);
    pAVar6->q = 4;
    pAVar6->p = 3;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.25;
    psVar5[2] = 0.07322330470336312;
    psVar5[3] = 0.5;
    psVar5[4] = 0.6966490299823633;
    psVar5[5] = 0.7063492063492064;
    psVar5[6] = 1.0;
    psVar8 = pAVar6->b;
    psVar8[2] = 0.9391524145239087;
    psVar8[3] = 0.5185422838949312;
    psVar8[4] = 0.7755100321672022;
    psVar8[5] = -0.5565015005668256;
    psVar8[6] = 0.125;
    *psVar8 = -0.4008516150096083;
    psVar8[1] = -0.40085161500960825;
    psVar2 = pAVar6->d;
    psVar2[2] = 0.6587096818817366;
    psVar2[3] = 0.500477735724069;
    psVar2[4] = 0.7607872310157867;
    psVar2[5] = -0.5714751468025063;
    psVar2[6] = 0.1357142857142857;
    *psVar2 = -0.24210689376668573;
    psVar2[1] = -0.24210689376668584;
    ppsVar4 = pAVar6->A;
    pdVar12 = ppsVar4[1];
    pdVar12[1] = 0.125;
    pdVar11 = ppsVar4[2];
    pdVar11[1] = -0.02588834764831844;
    pdVar11[2] = 0.125;
    pdVar10 = ppsVar4[3];
    pdVar10[1] = 0.33838834764831843;
    pdVar10[2] = -0.30177669529663687;
    pdVar10[3] = 0.125;
    pdVar1 = ppsVar4[4];
    pdVar1[1] = -0.3592453618381594;
    pdVar1[2] = 0.9365078600463644;
    pdVar1[3] = 0.3536318936123176;
    pdVar1[4] = 0.125;
    pdVar9 = ppsVar4[5];
    pdVar9[1] = 0.23361061091244562;
    pdVar9[2] = -0.0433153738101898;
    pdVar9[3] = 0.01903274535895701;
    pdVar9[4] = 0.13841061297554788;
    pdVar9[5] = 0.125;
    psVar2 = ppsVar4[6];
    *psVar2 = *psVar8;
    psVar2[1] = psVar8[1];
    psVar2[2] = psVar8[2];
    psVar2[3] = psVar8[3];
    psVar2[4] = psVar8[4];
    psVar2[5] = psVar8[5];
    psVar2[6] = psVar8[6];
    *pdVar12 = psVar5[1] - pdVar12[1];
    *pdVar11 = (psVar5[2] - pdVar11[1]) - pdVar11[2];
    *pdVar10 = ((psVar5[3] - pdVar10[1]) - pdVar10[2]) - pdVar10[3];
    *pdVar1 = (((psVar5[4] - pdVar1[1]) - pdVar1[2]) - pdVar1[3]) - pdVar1[4];
    dVar3 = ((((psVar5[5] - pdVar9[1]) - pdVar9[2]) - pdVar9[3]) - pdVar9[4]) - pdVar9[5];
    goto LAB_0012b600;
  case ARKODE_ESDIRK547L2SA_7_4_5:
    pAVar6 = ARKodeButcherTable_Alloc(7,1);
    pAVar6->q = 5;
    pAVar6->p = 4;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.368;
    psVar5[2] = 0.10778470452335051;
    psVar5[3] = 0.52;
    psVar5[4] = 0.6531582768582439;
    psVar5[5] = 1.04;
    psVar5[6] = 1.0;
    psVar8 = pAVar6->b;
    psVar8[2] = 0.42427748359919076;
    psVar8[3] = 0.27546898147535387;
    psVar8[4] = 0.3205107788979717;
    psVar8[5] = -0.05226101488479355;
    psVar8[6] = 0.184;
    *psVar8 = -0.07599811454386142;
    psVar8[1] = -0.07599811454386138;
    psVar2 = pAVar6->d;
    psVar2[2] = 0.4837275788865379;
    psVar2[3] = 0.23595105756244605;
    psVar2[4] = 0.3753833643342551;
    psVar2[5] = -0.03230666251372478;
    psVar2[6] = 0.15334335263909166;
    *psVar2 = -0.10804934545430289;
    psVar2[1] = -0.10804934545430295;
    ppsVar4 = pAVar6->A;
    ppsVar4[1][1] = 0.184;
    psVar2 = ppsVar4[2];
    psVar2[1] = -0.03810764773832474;
    psVar2[2] = 0.184;
    psVar2 = ppsVar4[3];
    psVar2[1] = 0.0216776649587785;
    psVar2[2] = 0.292644670082443;
    psVar2[3] = 0.184;
    psVar2 = ppsVar4[4];
    psVar2[1] = -0.8510462661735156;
    psVar2[2] = 1.753303815732698;
    psVar2[3] = 0.41794699347257747;
    psVar2[4] = 0.184;
    psVar2 = ppsVar4[5];
    psVar2[1] = -5.03561612174922;
    psVar2[2] = 8.971305293795128;
    psVar2[3] = 0.31505839963851934;
    psVar2[4] = 1.6408685500647917;
    psVar2[5] = 0.184;
    psVar2 = ppsVar4[6];
    *psVar2 = *psVar8;
    psVar2[1] = psVar8[1];
    psVar2[2] = psVar8[2];
    psVar2[3] = psVar8[3];
    psVar2[4] = psVar8[4];
    psVar2[5] = psVar8[5];
    psVar2[6] = psVar8[6];
    uVar13 = SUB84(psVar5[1],0);
    uVar14 = (undefined4)((ulong)psVar5[1] >> 0x20);
    ppsVar4 = pAVar6->A;
    goto LAB_0012ba33;
  case ARKODE_ESDIRK547L2SA2_7_4_5:
    pAVar6 = ARKodeButcherTable_Alloc(7,1);
    pAVar6->q = 5;
    pAVar6->p = 4;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.368;
    psVar5[2] = 0.6282152954766494;
    psVar5[3] = 0.1388101983002833;
    psVar5[4] = 0.6999586194045747;
    psVar5[5] = 0.9083769633507853;
    psVar5[6] = 1.0;
    psVar5 = pAVar6->b;
    psVar5[1] = -0.03946606910974026;
    psVar5[2] = 0.27263649025024267;
    psVar5[3] = 0.4321651725202882;
    psVar5[4] = 0.3524160862328891;
    psVar5[5] = -0.16228561078393952;
    psVar5[6] = 0.184;
    pdVar12 = pAVar6->b;
    *pdVar12 = (((((1.0 - pdVar12[1]) - pdVar12[2]) - pdVar12[3]) - pdVar12[4]) - pdVar12[5]) -
               pdVar12[6];
    psVar5 = pAVar6->d;
    psVar5[1] = -0.08068946656664744;
    psVar5[2] = 0.18289968461343553;
    psVar5[3] = 0.517013873766231;
    psVar5[4] = 0.4265997313024543;
    psVar5[5] = -0.10432685796713498;
    psVar5[6] = 0.13919250141830897;
    pdVar12 = pAVar6->d;
    *pdVar12 = (((((1.0 - pdVar12[1]) - pdVar12[2]) - pdVar12[3]) - pdVar12[4]) - pdVar12[5]) -
               pdVar12[6];
    ppsVar4 = pAVar6->A;
    ppsVar4[1][1] = 0.184;
    ppsVar4[2][1] = 0.22210764773832475;
    ppsVar4 = pAVar6->A;
    ppsVar4[2][2] = 0.184;
    ppsVar4[3][1] = -0.014049475381926283;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[3];
    psVar5[2] = -0.01709085093586415;
    psVar5[3] = 0.184;
    psVar5 = ppsVar4[4];
    psVar5[1] = -0.40838859254931464;
    psVar5[2] = 0.16646399821362964;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[4];
    psVar5[3] = 1.1662718062895745;
    psVar5[4] = 0.184;
    psVar5 = ppsVar4[5];
    psVar5[1] = -0.5392907235588114;
    psVar5[2] = -0.242234428845425;
    psVar5 = pAVar6->A[5];
    psVar5[3] = 1.4888806111225146;
    psVar5[4] = 0.5563122281913184;
    psVar5[5] = 0.184;
    psVar5 = pAVar6->b;
    psVar8 = pAVar6->A[6];
    *psVar8 = *psVar5;
    psVar8[1] = psVar5[1];
    pAVar6->A[6][2] = pAVar6->b[2];
    pAVar6->A[6][3] = pAVar6->b[3];
    pAVar6->A[6][4] = pAVar6->b[4];
    pAVar6->A[6][5] = pAVar6->b[5];
    pAVar6->A[6][6] = pAVar6->b[6];
    ppsVar4 = pAVar6->A;
    uVar13 = SUB84(pAVar6->c[1],0);
    uVar14 = (undefined4)((ulong)pAVar6->c[1] >> 0x20);
LAB_0012ba33:
    *ppsVar4[1] = (double)CONCAT44(uVar14,uVar13) - ppsVar4[1][1];
    pdVar12 = pAVar6->A[2];
    *pdVar12 = (pAVar6->c[2] - pdVar12[1]) - pdVar12[2];
    pdVar12 = pAVar6->A[3];
    *pdVar12 = ((pAVar6->c[3] - pdVar12[1]) - pdVar12[2]) - pdVar12[3];
    pdVar12 = pAVar6->A[4];
    *pdVar12 = (((pAVar6->c[4] - pdVar12[1]) - pdVar12[2]) - pdVar12[3]) - pdVar12[4];
    pdVar12 = pAVar6->A[5];
    *pdVar12 = ((((pAVar6->c[5] - pdVar12[1]) - pdVar12[2]) - pdVar12[3]) - pdVar12[4]) - pdVar12[5]
    ;
    break;
  case ARKODE_ARK2_DIRK_3_1_2:
    pAVar6 = ARKodeButcherTable_Alloc(3,1);
    pAVar6->q = 2;
    pAVar6->p = 1;
    ppsVar4 = pAVar6->A;
    psVar5 = ppsVar4[1];
    *psVar5 = 0.29289321881345254;
    psVar5[1] = 0.29289321881345254;
    psVar5 = ppsVar4[2];
    *psVar5 = 0.35355339059327373;
    psVar5[1] = 0.35355339059327373;
    psVar5[2] = 0.29289321881345254;
    psVar5 = pAVar6->b;
    *psVar5 = 0.35355339059327373;
    psVar5[1] = 0.35355339059327373;
    psVar5[2] = 0.29289321881345254;
    psVar5 = pAVar6->d;
    *psVar5 = 0.32322330470336313;
    psVar5[1] = 0.32322330470336313;
    sVar7 = 0.35355339059327373;
LAB_0012bc88:
    psVar5[2] = sVar7;
    psVar5 = pAVar6->c;
    psVar5[1] = 0.5857864376269049;
    psVar5[2] = 1.0;
    break;
  case ARKODE_BACKWARD_EULER_1_1:
    pAVar6 = ARKodeButcherTable_Alloc(1,0);
    pAVar6->q = 1;
    pAVar6->p = 0;
    sVar7 = 1.0;
    **pAVar6->A = 1.0;
    *pAVar6->b = 1.0;
    goto LAB_0012a9f5;
  case ARKODE_IMPLICIT_MIDPOINT_1_2:
    pAVar6 = ARKodeButcherTable_Alloc(1,0);
    pAVar6->q = 2;
    pAVar6->p = 0;
    sVar7 = 0.5;
    **pAVar6->A = 0.5;
    *pAVar6->b = 1.0;
LAB_0012a9f5:
    *pAVar6->c = sVar7;
    break;
  case ARKODE_IMPLICIT_TRAPEZOIDAL_2_2:
    pAVar6 = ARKodeButcherTable_Alloc(2,0);
    pAVar6->q = 2;
    pAVar6->p = 0;
    psVar5 = pAVar6->A[1];
    *psVar5 = 0.5;
    psVar5[1] = 0.5;
    psVar5 = pAVar6->b;
    *psVar5 = 0.5;
    psVar5[1] = 0.5;
    pAVar6->c[1] = 1.0;
    break;
  default:
    if (imethod == ARKODE_DIRK_NONE) {
      pAVar6 = (ARKodeButcherTable)0x0;
    }
    else {
      pAVar6 = (ARKodeButcherTable)0x0;
      arkProcessError((ARKodeMem)0x0,-0x16,0x29,"ARKodeButcherTable_LoadDIRK",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_butcher_dirk.c"
                      ,"Unknown Butcher table");
    }
  }
  return pAVar6;
}

Assistant:

ARKodeButcherTable ARKodeButcherTable_LoadDIRK(ARKODE_DIRKTableID imethod)
{
  /* Use X-macro to test each method name */
  switch (imethod)
  {
#define ARK_BUTCHER_TABLE(name, coeff) \
  case name: coeff break;
#include "arkode_butcher_dirk.def"
#undef ARK_BUTCHER_TABLE

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown Butcher table");
    return NULL;
  }
}